

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHashTree.h
# Opt level: O0

bool __thiscall
HighsHashTree<int,_int>::InnerLeaf<4>::erase_entry
          (InnerLeaf<4> *this,uint64_t fullHash,int hashPos,int *key)

{
  byte pos_00;
  bool bVar1;
  byte bVar2;
  uint16_t chunks;
  reference pvVar3;
  reference __src;
  int in_EDX;
  uint64_t in_RSI;
  HighsHashTableEntry<int,_int> *in_RDI;
  int pos;
  int startPos;
  uint8_t hashChunk;
  uint16_t hash;
  HighsHashTableEntry<int,_int> *in_stack_ffffffffffffffa8;
  HighsHashTableEntry<int,_int> *in_stack_ffffffffffffffb0;
  HighsHashTableEntry<int,_int> *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar4;
  int local_30;
  bool local_1;
  
  chunks = get_hash_chunks16(in_RSI,in_EDX);
  pos_00 = get_first_chunk16(chunks);
  bVar1 = Occupation::test((Occupation *)in_RDI,pos_00);
  if (bVar1) {
    local_30 = Occupation::num_set_until
                         ((Occupation *)in_stack_ffffffffffffffb0,
                          (uint8_t)((ulong)in_stack_ffffffffffffffa8 >> 0x38));
    local_30 = local_30 + -1;
    while( true ) {
      pvVar3 = std::array<unsigned_long,_55UL>::operator[]
                         ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffffb0,
                          (size_type)in_stack_ffffffffffffffa8);
      bVar2 = get_first_chunk16((uint16_t)*pvVar3);
      iVar4 = local_30;
      if (bVar2 <= pos_00) break;
      local_30 = local_30 + 1;
    }
    while (pvVar3 = std::array<unsigned_long,_55UL>::operator[]
                              ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffffb0,
                               (size_type)in_stack_ffffffffffffffa8), (ulong)chunks < *pvVar3) {
      iVar4 = iVar4 + 1;
    }
    bVar1 = find_key((InnerLeaf<4> *)CONCAT44(iVar4,in_stack_ffffffffffffffc8),&in_RDI->key_,
                     (uint16_t *)in_stack_ffffffffffffffb8,&in_stack_ffffffffffffffb0->key_);
    if (bVar1) {
      in_RDI[1].key_ = (int)*(uint64_t *)&in_RDI[1].key_ + -1;
      if (iVar4 < (int)*(uint64_t *)&in_RDI[1].key_) {
        std::array<HighsHashTableEntry<int,_int>,_54UL>::begin
                  ((array<HighsHashTableEntry<int,_int>,_54UL> *)0x56b844);
        in_stack_ffffffffffffffa8 =
             std::next<HighsHashTableEntry<int,int>*>
                       (in_stack_ffffffffffffffb0,(difference_type)in_stack_ffffffffffffffa8);
        std::array<HighsHashTableEntry<int,_int>,_54UL>::begin
                  ((array<HighsHashTableEntry<int,_int>,_54UL> *)0x56b86b);
        in_stack_ffffffffffffffb0 =
             std::next<HighsHashTableEntry<int,int>*>
                       (in_stack_ffffffffffffffb0,(difference_type)in_stack_ffffffffffffffa8);
        std::array<HighsHashTableEntry<int,_int>,_54UL>::begin
                  ((array<HighsHashTableEntry<int,_int>,_54UL> *)0x56b897);
        std::next<HighsHashTableEntry<int,int>*>
                  (in_stack_ffffffffffffffb0,(difference_type)in_stack_ffffffffffffffa8);
        std::move<HighsHashTableEntry<int,int>*,HighsHashTableEntry<int,int>*>
                  (in_RDI,in_stack_ffffffffffffffb8,in_stack_ffffffffffffffb0);
        pvVar3 = std::array<unsigned_long,_55UL>::operator[]
                           ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffffb0,
                            (size_type)in_stack_ffffffffffffffa8);
        __src = std::array<unsigned_long,_55UL>::operator[]
                          ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffffb0,
                           (size_type)in_stack_ffffffffffffffa8);
        memmove(pvVar3,__src,(long)(in_RDI[1].key_ - iVar4) << 3);
        pvVar3 = std::array<unsigned_long,_55UL>::operator[]
                           ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffffb0,
                            (size_type)in_stack_ffffffffffffffa8);
        bVar2 = get_first_chunk16((uint16_t)*pvVar3);
        if (bVar2 != pos_00) {
          Occupation::flip((Occupation *)in_RDI,pos_00);
        }
      }
      else if (local_30 == iVar4) {
        Occupation::flip((Occupation *)in_RDI,pos_00);
      }
      pvVar3 = std::array<unsigned_long,_55UL>::operator[]
                         ((array<unsigned_long,_55UL> *)in_stack_ffffffffffffffb0,
                          (size_type)in_stack_ffffffffffffffa8);
      *pvVar3 = 0;
      local_1 = true;
    }
    else {
      local_1 = false;
    }
  }
  else {
    local_1 = false;
  }
  return local_1;
}

Assistant:

bool erase_entry(uint64_t fullHash, int hashPos, const K& key) {
      uint16_t hash = get_hash_chunks16(fullHash, hashPos);
      uint8_t hashChunk = get_first_chunk16(hash);
      if (!occupation.test(hashChunk)) return false;

      int startPos = occupation.num_set_until(hashChunk) - 1;
      while (get_first_chunk16(hashes[startPos]) > hashChunk) ++startPos;

      int pos = startPos;
      while (hashes[pos] > hash) ++pos;

      if (!find_key(key, hash, pos)) return false;

      --size;
      if (pos < size) {
        std::move(std::next(entries.begin(), pos + 1),
                  std::next(entries.begin(), size + 1),
                  std::next(entries.begin(), pos));
        memmove(&hashes[pos], &hashes[pos + 1],
                sizeof(hashes[0]) * (size - pos));
        if (get_first_chunk16(hashes[startPos]) != hashChunk)
          occupation.flip(hashChunk);
      } else if (startPos == pos)
        occupation.flip(hashChunk);

      hashes[size] = 0;
      return true;
    }